

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnTableCopyExpr(Validator *this,TableCopyExpr *expr)

{
  Var local_b8;
  Var local_70;
  Enum local_24;
  TableCopyExpr *local_20;
  TableCopyExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (TableCopyExpr *)this;
  Var::Var(&local_70,&expr->dst_table);
  Var::Var(&local_b8,&local_20->src_table);
  local_24 = (Enum)SharedValidator::OnTableCopy
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)46>).super_Expr.loc,&local_70,
                              &local_b8);
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_b8);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnTableCopyExpr(TableCopyExpr* expr) {
  result_ |=
      validator_.OnTableCopy(expr->loc, expr->dst_table, expr->src_table);
  return Result::Ok;
}